

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_double_to_ratio(sexp ctx,double f)

{
  sexp psVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  undefined4 uVar6;
  sexp res;
  sexp scale;
  sexp whole;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_90;
  undefined1 local_88 [16];
  sexp local_70;
  double local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_90 = (sexp)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_70 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_68 = f;
  local_88._0_8_ = trunc(f);
  if (((double)local_88._0_8_ == local_68) && (!NAN((double)local_88._0_8_) && !NAN(local_68))) {
    psVar1 = sexp_double_to_bignum(ctx,local_68);
    psVar1 = sexp_bignum_normalize(psVar1);
    return psVar1;
  }
  local_58.var = &local_90;
  local_38.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  local_38.var = &local_60;
  local_48.next = &local_38;
  (ctx->value).context.saves = local_48.next;
  local_48.var = &local_70;
  (ctx->value).context.saves = &local_48;
  local_60 = sexp_double_to_bignum(ctx,(double)local_88._0_8_);
  local_90 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000001);
  local_70 = (sexp)&DAT_00000003;
  dVar5 = local_68 - (double)local_88._0_8_;
  local_88._8_8_ = 0;
  local_88._0_8_ = ABS(dVar5);
  dVar5 = trunc(ABS(dVar5));
  if (((double)local_88._0_8_ != dVar5) || (NAN((double)local_88._0_8_) || NAN(dVar5))) {
    uVar3 = 0;
    do {
      psVar1 = sexp_bignum_fxmul(ctx,(sexp)0x0,local_90,10,0);
      uVar6 = local_88._12_4_;
      dVar5 = local_88._0_8_ * 10.0;
      local_88._8_4_ = local_88._8_4_;
      local_88._0_8_ = dVar5;
      local_88._12_4_ = uVar6;
      local_90 = psVar1;
      dVar5 = trunc(dVar5 / 10.0);
      dVar5 = (double)local_88._0_8_ - dVar5 * 10.0;
      uVar2 = (ulong)dVar5;
      local_90 = sexp_bignum_fxadd(ctx,psVar1,
                                   (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f |
                                   uVar2);
      dVar5 = trunc((double)local_88._0_8_);
      uVar6 = local_88._12_4_;
      local_88._8_4_ = local_88._8_4_;
      local_88._0_8_ = local_88._0_8_ - dVar5;
      local_88._12_4_ = uVar6;
      local_70 = sexp_mul(ctx,local_70,(sexp)&DAT_00000015);
      dVar5 = trunc((double)local_88._0_8_);
      if (((double)local_88._0_8_ == dVar5) && (!NAN((double)local_88._0_8_) && !NAN(dVar5))) break;
      bVar4 = uVar3 < 0xe;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  (local_90->value).flonum_bits[0] = -(local_68 < 0.0) | 1;
  psVar1 = sexp_bignum_normalize(local_90);
  local_90 = psVar1;
  local_70 = sexp_bignum_normalize(local_70);
  local_90 = sexp_make_ratio(ctx,psVar1,local_70);
  local_90 = sexp_ratio_normalize(ctx,local_90,(sexp)&DAT_0000003e);
  psVar1 = sexp_add(ctx,local_90,local_60);
  (ctx->value).context.saves = local_58.next;
  return psVar1;
}

Assistant:

sexp sexp_double_to_ratio (sexp ctx, double f) {
  int sign, i;
  sexp_gc_var3(res, whole, scale);
  if (f == trunc(f))
    return sexp_bignum_normalize(sexp_double_to_bignum(ctx, f));
  sexp_gc_preserve3(ctx, res, whole, scale);
  whole = sexp_double_to_bignum(ctx, trunc(f));
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = SEXP_ONE;
  sign = (f < 0 ? -1 : 1);
  for (i=0, f=fabs(f-trunc(f)); f != trunc(f) && i < 15; i++) {
    res = sexp_bignum_fxmul(ctx, NULL, res, 10, 0);
    f = f * 10;
    res = sexp_bignum_fxadd(ctx, res, (sexp_uint_t)double_10s_digit(f));
    f = f - trunc(f);
    scale = sexp_mul(ctx, scale, SEXP_TEN);
  }
  sexp_bignum_sign(res) = sign;
  res = sexp_bignum_normalize(res);
  scale = sexp_bignum_normalize(scale);
  res = sexp_make_ratio(ctx, res, scale);
  res = sexp_ratio_normalize(ctx, res, SEXP_FALSE);
  res = sexp_add(ctx, res, whole);
  sexp_gc_release3(ctx);
  return res;
}